

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CompileShader
          (ShaderImageLoadStoreBase *this,GLuint shader)

{
  GLchar local_428 [8];
  GLchar log [1024];
  int local_20;
  GLsizei length;
  GLint status;
  GLuint shader_local;
  ShaderImageLoadStoreBase *this_local;
  
  length = shader;
  _status = this;
  glu::CallLogWrapper::glCompileShader
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,shader);
  glu::CallLogWrapper::glGetShaderiv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,length,0x8b81,&local_20
            );
  if (local_20 == 0) {
    glu::CallLogWrapper::glGetShaderInfoLog
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,length,0x400,
               (GLsizei *)(log + 0x3fc),local_428);
    if (1 < (int)log._1020_4_) {
      anon_unknown_0::Output("Shader Info Log:\n%s\n",local_428);
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CompileShader(GLuint shader)
	{
		glCompileShader(shader);

		GLint status;
		glGetShaderiv(shader, GL_COMPILE_STATUS, &status);
		if (status == GL_FALSE)
		{
			GLsizei length;
			GLchar  log[1024];
			glGetShaderInfoLog(shader, sizeof(log), &length, log);
			if (length > 1)
			{
				Output("Shader Info Log:\n%s\n", log);
			}
			return false;
		}
		return true;
	}